

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_ObjectRenderingAttributes::Write(ON_ObjectRenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,3);
  if (bVar1) {
    bVar2 = ON_BinaryArchive::WriteArray(archive,(ON_ClassArray<ON_MaterialRef> *)this);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteArray(archive,&this->m_mappings);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::WriteBool(archive,this->m_bCastsShadows);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteBool(archive,this->m_bReceivesShadows);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::WriteBool(archive,(bool)(this->m_bits & 1));
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_ObjectRenderingAttributes::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 3 );
  if ( !rc )
    return false;
  for(;;)
  {
    // DO NOT CALL ON_RenderingAttributes::Write
    rc = archive.WriteArray(m_materials);
    if ( !rc ) break;
    rc = archive.WriteArray(m_mappings);
    if ( !rc ) break;

    // version 1.2 fields added 20061129
    rc = archive.WriteBool(m_bCastsShadows);
    if ( !rc ) break;
    rc = archive.WriteBool(m_bReceivesShadows);
    if ( !rc ) break;

    // version 1.3 fields added 20101019
    bool b = AdvancedTexturePreview();
    rc = archive.WriteBool(b);
    if ( !rc ) break;

    break;
  }
  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}